

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O0

int TIFFInitCCITTRLE(TIFF *tif,int scheme)

{
  int iVar1;
  int scheme_local;
  TIFF *tif_local;
  
  iVar1 = InitCCITTFax3(tif);
  if (iVar1 == 0) {
    tif_local._4_4_ = 0;
  }
  else {
    tif->tif_decoderow = Fax3DecodeRLE;
    tif->tif_decodestrip = Fax3DecodeRLE;
    tif->tif_decodetile = Fax3DecodeRLE;
    tif_local._4_4_ = TIFFSetField(tif,0x10000,7);
  }
  return tif_local._4_4_;
}

Assistant:

int TIFFInitCCITTRLE(TIFF *tif, int scheme)
{
    (void)scheme;
    if (InitCCITTFax3(tif))
    { /* reuse G3 support */
        tif->tif_decoderow = Fax3DecodeRLE;
        tif->tif_decodestrip = Fax3DecodeRLE;
        tif->tif_decodetile = Fax3DecodeRLE;
        /*
         * Suppress RTC+EOLs when encoding and byte-align data.
         */
        return TIFFSetField(tif, TIFFTAG_FAXMODE,
                            FAXMODE_NORTC | FAXMODE_NOEOL | FAXMODE_BYTEALIGN);
    }
    else
        return (0);
}